

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

void __thiscall
QGraphicsScenePrivate::storeMouseButtonsForMouseGrabber
          (QGraphicsScenePrivate *this,QGraphicsSceneMouseEvent *event)

{
  QGraphicsItemPrivate *this_00;
  MouseButtons MVar1;
  QWidget *viewport;
  QPoint QVar2;
  int i;
  MouseButton MVar3;
  long in_FS_OFFSET;
  QPointF local_60;
  QPointF local_50;
  MouseButton local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  for (MVar3 = LeftButton; MVar3 < (ExtraButton2|LeftButton); MVar3 = MVar3 * 2) {
    MVar1 = QGraphicsSceneMouseEvent::buttons(event);
    if (((uint)MVar1.super_QFlagsStorageHelper<Qt::MouseButton,_4>.
               super_QFlagsStorage<Qt::MouseButton>.i & MVar3) != NoButton) {
      this_00 = ((this->mouseGrabberItems).d.ptr[(this->mouseGrabberItems).d.size + -1]->d_ptr).d;
      local_3c = MVar3;
      local_60 = QGraphicsSceneMouseEvent::scenePos(event);
      viewport = QGraphicsSceneEvent::widget(&event->super_QGraphicsSceneEvent);
      local_50 = QGraphicsItemPrivate::genericMapFromScene(this_00,&local_60,viewport);
      QMap<Qt::MouseButton,_QPointF>::insert(&this->mouseGrabberButtonDownPos,&local_3c,&local_50);
      local_60.xp._0_4_ = MVar3;
      local_50 = QGraphicsSceneMouseEvent::scenePos(event);
      QMap<Qt::MouseButton,_QPointF>::insert
                (&this->mouseGrabberButtonDownScenePos,(MouseButton *)&local_60,&local_50);
      local_60.xp._0_4_ = MVar3;
      QVar2 = QGraphicsSceneMouseEvent::screenPos(event);
      local_50.xp = (qreal)QVar2;
      QMap<Qt::MouseButton,_QPoint>::insert
                (&this->mouseGrabberButtonDownScreenPos,(MouseButton *)&local_60,(QPoint *)&local_50
                );
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::storeMouseButtonsForMouseGrabber(QGraphicsSceneMouseEvent *event)
{
    for (int i = 0x1; i <= 0x10; i <<= 1) {
        if (event->buttons() & i) {
            mouseGrabberButtonDownPos.insert(Qt::MouseButton(i),
                                             mouseGrabberItems.constLast()->d_ptr->genericMapFromScene(event->scenePos(),
                                                                                                       event->widget()));
            mouseGrabberButtonDownScenePos.insert(Qt::MouseButton(i), event->scenePos());
            mouseGrabberButtonDownScreenPos.insert(Qt::MouseButton(i), event->screenPos());
        }
    }
}